

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSValue JVar1;
  JSValue ctor;
  int iVar2;
  undefined8 in_RDX;
  void *in_RSI;
  JSContext *in_RDI;
  long in_R8;
  JSValue JVar3;
  int64_t unaff_retaddr;
  JSContext *in_stack_00000010;
  JSValue in_stack_00000018;
  int tag;
  JSValue ret;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_18;
  int class_id;
  JSContext *in_stack_fffffffffffffff0;
  JSValueUnion in_stack_fffffffffffffff8;
  
  local_18 = (undefined4)in_RDX;
  class_id = (int)((ulong)in_RDX >> 0x20);
  JVar3.tag._0_4_ = local_18;
  JVar3.u.ptr = in_RSI;
  JVar3.tag._4_4_ = class_id;
  iVar2 = JS_IsUndefined(JVar3);
  if (iVar2 == 0) {
    JVar3 = JS_GetActiveFunction(in_RDI);
    local_48 = JVar3.u;
    if (in_RSI != local_48) {
      ctor.tag = unaff_retaddr;
      ctor.u.float64 = in_stack_fffffffffffffff8.float64;
      JVar3 = js_create_from_ctor(in_stack_fffffffffffffff0,ctor,class_id);
      local_58 = JVar3.u;
      local_50 = JVar3.tag;
      goto LAB_0014e92d;
    }
  }
  if (*(int *)(in_R8 + 8) == 2 || *(int *)(in_R8 + 8) == 3) {
    JVar3 = JS_NewObject((JSContext *)0x14e8d1);
    local_70 = JVar3.u;
    local_68 = JVar3.tag;
    local_58 = local_70;
    local_50 = local_68;
  }
  else {
    JVar3 = JS_ToObject(in_stack_00000010,in_stack_00000018);
    local_80 = JVar3.u;
    local_78 = JVar3.tag;
    local_58 = local_80;
    local_50 = local_78;
  }
LAB_0014e92d:
  JVar1.tag = local_50;
  JVar1.u.float64 = local_58;
  return JVar1;
}

Assistant:

static JSValue js_object_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue ret;
    if (!JS_IsUndefined(new_target) &&
        JS_VALUE_GET_OBJ(new_target) !=
        JS_VALUE_GET_OBJ(JS_GetActiveFunction(ctx))) {
        ret = js_create_from_ctor(ctx, new_target, JS_CLASS_OBJECT);
    } else {
        int tag = JS_VALUE_GET_NORM_TAG(argv[0]);
        switch(tag) {
        case JS_TAG_NULL:
        case JS_TAG_UNDEFINED:
            ret = JS_NewObject(ctx);
            break;
        default:
            ret = JS_ToObject(ctx, argv[0]);
            break;
        }
    }
    return ret;
}